

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall
llm_build_gemma3::llm_build_gemma3
          (llm_build_gemma3 *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  undefined4 uVar1;
  undefined8 uVar2;
  bool bVar3;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  llm_graph_input_attn_kv_unified *plVar6;
  ggml_tensor *pgVar7;
  ggml_tensor *pgVar8;
  ggml_tensor *pgVar9;
  llama_hparams *wo_b;
  ggml_cgraph *gf_00;
  ggml_tensor *down;
  ggml_tensor *gate_s;
  const_reference pvVar10;
  pointer plVar11;
  undefined8 in_RCX;
  long in_RSI;
  long in_RDI;
  ggml_tensor *sa_out;
  ggml_tensor *inp_out_ids;
  ggml_tensor *Vcur;
  ggml_tensor *Kcur;
  ggml_tensor *Qcur;
  float freq_scale_l;
  float freq_base_l;
  bool is_swa;
  int il;
  llm_graph_input_attn_kv_unified *inp_attn;
  ggml_tensor *inp_pos;
  ggml_tensor *inpL;
  ggml_tensor *cur;
  int64_t n_embd_head;
  ggml_tensor *in_stack_fffffffffffffda8;
  int iVar12;
  llama_hparams *in_stack_fffffffffffffdb0;
  ggml_tensor *in_stack_fffffffffffffdb8;
  llama_hparams *in_stack_fffffffffffffdc0;
  ggml_tensor *mw;
  ggml_tensor *in_stack_fffffffffffffdc8;
  undefined4 uVar14;
  ggml_tensor *pgVar13;
  llm_graph_context *in_stack_fffffffffffffdd0;
  ggml_tensor *in_stack_fffffffffffffe00;
  ggml_tensor *in_stack_fffffffffffffe08;
  llm_graph_context *in_stack_fffffffffffffe10;
  ggml_tensor *in_stack_fffffffffffffe28;
  ggml_tensor *in_stack_fffffffffffffe30;
  llm_graph_context *in_stack_fffffffffffffe50;
  ggml_tensor *in_stack_fffffffffffffe78;
  ggml_tensor *in_stack_fffffffffffffe80;
  ggml_tensor *in_stack_fffffffffffffe88;
  llm_ffn_op_type type_op;
  llm_ffn_gate_type type_gate;
  ggml_tensor *in_stack_fffffffffffffeb8;
  llm_graph_context *in_stack_fffffffffffffec0;
  undefined4 local_d4;
  ggml_tensor *in_stack_ffffffffffffff70;
  float kq_scale;
  ggml_tensor *in_stack_ffffffffffffff78;
  undefined4 uVar15;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar16;
  ggml_tensor *in_stack_ffffffffffffffb8;
  ggml_tensor *in_stack_ffffffffffffffc0;
  int iVar17;
  
  llm_graph_context::llm_graph_context
            ((llm_graph_context *)in_stack_fffffffffffffdc0,
             (llm_graph_params *)in_stack_fffffffffffffdb8);
  uVar1 = *(undefined4 *)(*(long *)(in_RDI + 8) + 0x20);
  pgVar4 = llm_graph_context::build_inp_embd(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  if (*(long *)(*(long *)(in_RDI + 0x18) + 0x10) != 0) {
    uVar2 = *(undefined8 *)(in_RDI + 0xc0);
    sqrtf((float)*(long *)(in_RDI + 0x20));
    pgVar4 = (ggml_tensor *)ggml_scale(uVar2,pgVar4);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               &in_stack_fffffffffffffdb0->vocab_only,
               (int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
  }
  pgVar5 = llm_graph_context::build_inp_pos(in_stack_fffffffffffffe10);
  plVar6 = llm_graph_context::build_attn_inp_kv_unified(in_stack_fffffffffffffe50);
  iVar16 = 0;
  while( true ) {
    kq_scale = (float)((ulong)in_stack_ffffffffffffff70 >> 0x20);
    iVar12 = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
    if (*(long *)(in_RDI + 0x28) <= (long)iVar16) break;
    bVar3 = llama_hparams::is_swa
                      (in_stack_fffffffffffffdc0,
                       (uint32_t)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
    in_stack_ffffffffffffffa0 = CONCAT13(bVar3,(int3)in_stack_ffffffffffffffa0);
    if (bVar3) {
      uVar15 = *(undefined4 *)(*(long *)(in_RDI + 8) + 0x18b4);
      local_d4 = *(undefined4 *)(*(long *)(in_RDI + 8) + 0x18bc);
    }
    else {
      uVar15 = *(undefined4 *)(*(long *)(in_RDI + 0x10) + 0x18);
      local_d4 = *(undefined4 *)(*(long *)(in_RDI + 0x10) + 0x1c);
    }
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar16);
    pgVar7 = llm_graph_context::build_norm
                       (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                        (ggml_tensor *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                        (llm_norm_type)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                        (int)in_stack_fffffffffffffdb0);
    iVar17 = (int)pgVar7;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               &in_stack_fffffffffffffdb0->vocab_only,iVar12);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar16);
    pgVar7 = llm_graph_context::build_lora_mm
                       (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                        in_stack_fffffffffffffe00);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               &in_stack_fffffffffffffdb0->vocab_only,iVar12);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar16);
    pgVar8 = llm_graph_context::build_lora_mm
                       (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                        in_stack_fffffffffffffe00);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               &in_stack_fffffffffffffdb0->vocab_only,iVar12);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar16);
    pgVar9 = llm_graph_context::build_lora_mm
                       (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                        in_stack_fffffffffffffe00);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               &in_stack_fffffffffffffdb0->vocab_only,iVar12);
    ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),pgVar7,uVar1,*(undefined8 *)(in_RDI + 0x48),
                    (long)*(int *)(in_RDI + 0xa8));
    ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),pgVar8,uVar1,*(undefined8 *)(in_RDI + 0x50),
                    (long)*(int *)(in_RDI + 0xa8));
    wo_b = (llama_hparams *)
           ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),pgVar9,uVar1,
                           *(undefined8 *)(in_RDI + 0x50),(long)*(int *)(in_RDI + 0xa8));
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar16);
    pgVar7 = llm_graph_context::build_norm
                       (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                        (ggml_tensor *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                        (llm_norm_type)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                        (int)in_stack_fffffffffffffdb0);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               &in_stack_fffffffffffffdb0->vocab_only,iVar12);
    gf_00 = (ggml_cgraph *)
            ggml_rope_ext(uVar15,local_d4,*(undefined4 *)(in_RDI + 0x90),
                          *(undefined4 *)(in_RDI + 0x94),*(undefined4 *)(in_RDI + 0x98),
                          *(undefined4 *)(in_RDI + 0x9c),*(undefined8 *)(in_RDI + 0xc0),pgVar7,
                          pgVar5,0,*(undefined4 *)(in_RDI + 0x30),*(undefined4 *)(in_RDI + 0xb8));
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar16);
    pgVar7 = llm_graph_context::build_norm
                       (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                        (ggml_tensor *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                        (llm_norm_type)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                        (int)in_stack_fffffffffffffdb0);
    uVar14 = (undefined4)((ulong)in_stack_fffffffffffffdc8 >> 0x20);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               &in_stack_fffffffffffffdb0->vocab_only,iVar12);
    pgVar7 = (ggml_tensor *)
             ggml_rope_ext(uVar15,local_d4,*(undefined4 *)(in_RDI + 0x90),
                           *(undefined4 *)(in_RDI + 0x94),*(undefined4 *)(in_RDI + 0x98),
                           *(undefined4 *)(in_RDI + 0x9c),*(undefined8 *)(in_RDI + 0xc0),pgVar7,
                           pgVar5,0,*(undefined4 *)(in_RDI + 0x30),*(undefined4 *)(in_RDI + 0xb8));
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               &in_stack_fffffffffffffdb0->vocab_only,iVar12);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               &in_stack_fffffffffffffdb0->vocab_only,iVar12);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               &in_stack_fffffffffffffdb0->vocab_only,iVar12);
    iVar12 = (int)plVar6;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar16);
    pgVar13 = (ggml_tensor *)CONCAT44(uVar14,iVar16);
    mw = (ggml_tensor *)0x0;
    pgVar9 = (ggml_tensor *)0x0;
    pgVar8 = llm_graph_context::build_attn
                       ((llm_graph_context *)CONCAT44(iVar16,in_stack_ffffffffffffffa0),
                        (llm_graph_input_attn_kv_unified *)CONCAT44(uVar15,local_d4),gf_00,pgVar7,
                        (ggml_tensor *)wo_b,in_stack_ffffffffffffff78,pgVar5,
                        in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0,pgVar4,kq_scale,iVar17);
    type_op = (llm_ffn_op_type)pgVar8;
    iVar17 = (int)((ulong)pgVar7 >> 0x20);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar16);
    pgVar8 = llm_graph_context::build_norm
                       (in_stack_fffffffffffffdd0,pgVar13,mw,pgVar9,
                        (llm_norm_type)((ulong)wo_b >> 0x20),(int)wo_b);
    pgVar7 = pgVar8;
    llm_graph_context::cb((llm_graph_context *)mw,pgVar9,&wo_b->vocab_only,iVar17);
    type_gate = (llm_ffn_gate_type)pgVar8;
    if ((long)iVar16 == *(long *)(in_RDI + 0x28) + -1) {
      in_stack_fffffffffffffe88 =
           llm_graph_context::build_inp_out_ids((llm_graph_context *)in_stack_fffffffffffffe00);
      in_stack_ffffffffffffff78 = in_stack_fffffffffffffe88;
      in_stack_fffffffffffffe80 =
           (ggml_tensor *)
           ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),pgVar7,in_stack_fffffffffffffe88);
      pgVar7 = in_stack_fffffffffffffe80;
      in_stack_fffffffffffffe78 =
           (ggml_tensor *)
           ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),pgVar4,in_stack_ffffffffffffff78);
      pgVar4 = in_stack_fffffffffffffe78;
    }
    down = (ggml_tensor *)ggml_add(*(undefined8 *)(in_RDI + 0xc0),pgVar7,pgVar4);
    pgVar8 = down;
    llm_graph_context::cb((llm_graph_context *)mw,pgVar9,&wo_b->vocab_only,iVar17);
    in_stack_ffffffffffffff70 = pgVar8;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar16);
    gate_s = llm_graph_context::build_norm
                       (in_stack_fffffffffffffdd0,pgVar13,mw,pgVar9,
                        (llm_norm_type)((ulong)wo_b >> 0x20),(int)wo_b);
    pgVar13 = gate_s;
    llm_graph_context::cb((llm_graph_context *)mw,pgVar9,&wo_b->vocab_only,iVar17);
    pvVar10 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                        ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                         (long)iVar16);
    pgVar4 = pvVar10->ffn_up;
    pvVar10 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                        ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                         (long)iVar16);
    pgVar7 = pvVar10->ffn_gate;
    pvVar10 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                        ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                         (long)iVar16);
    in_stack_fffffffffffffdb8 = pvVar10->ffn_down;
    in_stack_fffffffffffffdd0 = (llm_graph_context *)0x0;
    in_stack_fffffffffffffdc8 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffdc0 = (llama_hparams *)0x0;
    in_stack_fffffffffffffdb0 = (llama_hparams *)0x0;
    in_stack_fffffffffffffda8 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffe28 =
         llm_graph_context::build_ffn
                   ((llm_graph_context *)&stack0xfffffffffffffda8,pgVar7,pgVar4,pgVar13,
                    in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,pgVar8,gate_s,down,
                    in_stack_fffffffffffffe78,in_stack_fffffffffffffe80,in_stack_fffffffffffffe88,
                    type_op,type_gate,iVar12);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               &in_stack_fffffffffffffdb0->vocab_only,
               (int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar16);
    in_stack_fffffffffffffe30 =
         llm_graph_context::build_norm
                   (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                    (ggml_tensor *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                    (llm_norm_type)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                    (int)in_stack_fffffffffffffdb0);
    pgVar4 = in_stack_fffffffffffffe30;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               &in_stack_fffffffffffffdb0->vocab_only,
               (int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
    ggml_add(*(undefined8 *)(in_RDI + 0xc0),pgVar4,in_stack_ffffffffffffff70);
    pgVar4 = llm_graph_context::build_cvec
                       ((llm_graph_context *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,0);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               &in_stack_fffffffffffffdb0->vocab_only,
               (int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
    iVar16 = iVar16 + 1;
  }
  pgVar5 = llm_graph_context::build_norm
                     (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                      (ggml_tensor *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                      (llm_norm_type)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                      (int)in_stack_fffffffffffffdb0);
  pgVar4 = pgVar5;
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
             &in_stack_fffffffffffffdb0->vocab_only,iVar12);
  plVar11 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4ddb76);
  plVar11->t_embd = pgVar4;
  pgVar5 = llm_graph_context::build_lora_mm
                     ((llm_graph_context *)pgVar5,in_stack_fffffffffffffe08,pgVar4);
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
             &in_stack_fffffffffffffdb0->vocab_only,iVar12);
  pgVar4 = pgVar5;
  plVar11 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4ddbfb);
  plVar11->t_logits = pgVar5;
  ggml_build_forward_expand(in_RCX,pgVar4);
  return;
}

Assistant:

llm_build_gemma3(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_k;

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // important: do not normalize weights for raw embeddings input (i.e. encoded image emdeddings)
        if (ubatch.token) {
            inpL = ggml_scale(ctx0, inpL, sqrtf(n_embd));
            cb(inpL, "inp_scaled", -1);
        }

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        // TODO: is causal == true correct? might need some changes
        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            const bool is_swa = hparams.is_swa(il);

            const float freq_base_l  = is_swa ? hparams.rope_freq_base_train_swa  : cparams.rope_freq_base;
            const float freq_scale_l = is_swa ? hparams.rope_freq_scale_train_swa : cparams.rope_freq_scale;

            // norm
            cur = build_norm(inpL, model.layers[il].attn_norm, NULL, LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);

            // self-attention
            {
                // compute Q and K and RoPE them
                ggml_tensor * Qcur = build_lora_mm(model.layers[il].wq, cur);
                cb(Qcur, "Qcur", il);

                ggml_tensor * Kcur = build_lora_mm(model.layers[il].wk, cur);
                cb(Kcur, "Kcur", il);

                ggml_tensor * Vcur = build_lora_mm(model.layers[il].wv, cur);
                cb(Vcur, "Vcur", il);

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                Qcur = build_norm(Qcur, model.layers[il].attn_q_norm, NULL, LLM_NORM_RMS, il);
                cb(Qcur, "Qcur_normed", il);

                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base_l, freq_scale_l,
                        ext_factor, attn_factor, beta_fast, beta_slow);

                Kcur = build_norm(Kcur, model.layers[il].attn_k_norm, NULL, LLM_NORM_RMS, il);
                cb(Kcur, "Kcur_normed", il);

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base_l, freq_scale_l,
                        ext_factor, attn_factor, beta_fast, beta_slow);

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, NULL,
                        Qcur, Kcur, Vcur, nullptr, nullptr, hparams.f_attention_scale, il);
            }

            cur = build_norm(cur,
                    model.layers[il].attn_post_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_post_norm", il);

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur  = ggml_get_rows(ctx0,  cur, inp_out_ids);
                inpL = ggml_get_rows(ctx0, inpL, inp_out_ids);
            }

            ggml_tensor * sa_out = ggml_add(ctx0, cur, inpL);
            cb(sa_out, "sa_out", il);

            cur = build_norm(sa_out,
                    model.layers[il].ffn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "ffn_norm", il);

            // feed-forward network
            {
                cur = build_ffn(cur,
                        model.layers[il].ffn_up,   NULL, NULL,
                        model.layers[il].ffn_gate, NULL, NULL,
                        model.layers[il].ffn_down, NULL, NULL,
                        NULL,
                        LLM_FFN_GELU, LLM_FFN_PAR, il);
                cb(cur, "ffn_out", il);
            }

            cur = build_norm(cur,
                    model.layers[il].ffn_post_norm, NULL,
                    LLM_NORM_RMS, -1);
            cb(cur, "ffn_post_norm", -1);

            cur = ggml_add(ctx0, cur, sa_out);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm, NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // lm_head
        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }